

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::apps::Clone::getMessage(Clone *this,int index)

{
  Message *pMVar1;
  Message *this_00;
  uint in_EDX;
  undefined4 in_register_00000034;
  long lVar2;
  
  lVar2 = CONCAT44(in_register_00000034,index);
  if (((int)in_EDX < 0) ||
     ((int)((ulong)(*(long *)(lVar2 + 0x148) - *(long *)(lVar2 + 0x140)) >> 3) <= (int)in_EDX)) {
    (this->super_App)._vptr_App = (_func_int **)0x0;
    this_00 = (Message *)0x0;
  }
  else {
    pMVar1 = *(Message **)(*(long *)(lVar2 + 0x140) + (ulong)in_EDX * 8);
    this_00 = (Message *)operator_new(0x100);
    Message::Message(this_00,pMVar1);
  }
  (this->super_App)._vptr_App = (_func_int **)this_00;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> Clone::getMessage(int index) const
{
    if (isValidIndex(index, messages)) {
        return std::make_unique<Message>(*messages[index]);
    }
    return nullptr;
}